

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiID *pIVar1;
  ImGuiID *pIVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiContext *g;
  ImVec2 pos;
  ImVec2 local_18;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->MovingWindow;
  if (pIVar4 == (ImGuiWindow *)0x0) {
    if ((GImGui->ActiveIdWindow != (ImGuiWindow *)0x0) &&
       (IVar3 = GImGui->ActiveId, GImGui->ActiveIdWindow->MoveId == IVar3)) {
      GImGui->ActiveIdIsAlive = IVar3;
      if (pIVar5->ActiveIdPreviousFrame == IVar3) {
        pIVar5->ActiveIdPreviousFrameIsAlive = true;
      }
      if ((pIVar5->IO).MouseDown[0] == false) goto LAB_0012ec92;
    }
    return;
  }
  pIVar1 = &GImGui->ActiveId;
  pIVar2 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = *pIVar1;
  if (*pIVar2 == *pIVar1) {
    pIVar5->ActiveIdPreviousFrameIsAlive = true;
  }
  pIVar4 = pIVar4->RootWindow;
  if (pIVar4 == (ImGuiWindow *)0x0) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0xf25,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  if (((pIVar5->IO).MouseDown[0] == true) &&
     (bVar6 = IsMousePosValid(&(pIVar5->IO).MousePos), bVar6)) {
    local_18.y = (pIVar5->IO).MousePos.y - (pIVar5->ActiveIdClickOffset).y;
    local_18.x = (pIVar5->IO).MousePos.x - (pIVar5->ActiveIdClickOffset).x;
    SetWindowPos(pIVar4,&local_18,1);
    FocusWindow(pIVar5->MovingWindow);
    return;
  }
  pIVar5->MovingWindow = (ImGuiWindow *)0x0;
LAB_0012ec92:
  SetActiveID(0,(ImGuiWindow *)0x0);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            SetWindowPos(moving_window, pos, ImGuiCond_Always);
            FocusWindow(g.MovingWindow);
        }
        else
        {
            g.MovingWindow = NULL;
            ClearActiveID();
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}